

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_calculation.cc
# Opt level: O2

bool __thiscall
sptk::EntropyCalculation::Run
          (EntropyCalculation *this,vector<double,_std::allocator<double>_> *probability,
          double *entropy)

{
  double dVar1;
  EntropyUnits EVar2;
  pointer pdVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int i;
  long lVar7;
  double dVar8;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if (entropy != (double *)0x0) {
    pdVar3 = (probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = this->num_element_;
    bVar5 = false;
    if ((long)(probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar3 >> 3 == (long)iVar6) {
      EVar2 = this->entropy_unit_;
      if (EVar2 == kBit) {
        dVar4 = 0.0;
        for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
          dVar1 = pdVar3[lVar7];
          dVar8 = FloorLog2(dVar1);
          dVar4 = dVar4 + dVar8 * dVar1;
          iVar6 = this->num_element_;
        }
      }
      else if (EVar2 == kNat) {
        dVar4 = 0.0;
        for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
          dVar1 = pdVar3[lVar7];
          dVar8 = FloorLog(dVar1);
          dVar4 = dVar4 + dVar8 * dVar1;
          iVar6 = this->num_element_;
        }
      }
      else {
        if (EVar2 != kDit) {
          return false;
        }
        dVar4 = 0.0;
        for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
          dVar1 = pdVar3[lVar7];
          dVar8 = FloorLog10(dVar1);
          dVar4 = dVar4 + dVar8 * dVar1;
          iVar6 = this->num_element_;
        }
      }
      *entropy = -dVar4;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool EntropyCalculation::Run(const std::vector<double>& probability,
                             double* entropy) const {
  if (!is_valid_ ||
      probability.size() != static_cast<std::size_t>(num_element_) ||
      NULL == entropy) {
    return false;
  }

  const double* p(&(probability[0]));
  double sum(0.0);

  switch (entropy_unit_) {
    case kBit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog2(p[i]);
      }
      break;
    }
    case kNat: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog(p[i]);
      }
      break;
    }
    case kDit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog10(p[i]);
      }
      break;
    }
    default: {
      return false;
    }
  }

  *entropy = -sum;

  return true;
}